

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

int wally_cleanup(uint32_t flags)

{
  undefined4 local_c;
  uint32_t flags_local;
  
  if (flags == 0) {
    if (global_ctx != (secp256k1_context *)0x0) {
      wally_secp_context_free(global_ctx);
      global_ctx = (secp256k1_context *)0x0;
    }
    local_c = 0;
  }
  else {
    local_c = -2;
  }
  return local_c;
}

Assistant:

int wally_cleanup(uint32_t flags)
{
    if (flags)
        return WALLY_EINVAL;
    if (global_ctx) {
        wally_secp_context_free(global_ctx);
        global_ctx = NULL;
    }
    return WALLY_OK;
}